

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.hpp
# Opt level: O0

bool __thiscall Cube::intersect(Cube *this,Ray *ray,Hit *result)

{
  float *pfVar1;
  void *in_RDX;
  float *in_RSI;
  point pVar2;
  float tminz_1;
  float tminz;
  float tminy_1;
  float tminy;
  vec3f resN;
  float tmax;
  float tmin;
  vec2f in_stack_ffffffffffffff10;
  vec3f *Ng;
  float fVar3;
  undefined4 in_stack_ffffffffffffff24;
  vec3f *p;
  float fVar4;
  undefined4 in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff4c;
  Ray *in_stack_ffffffffffffff50;
  float local_84;
  vec3f local_80;
  float local_74;
  float local_70;
  vec3f local_6c;
  float local_60;
  float local_5c;
  vec3f local_58;
  float local_4c;
  float local_48;
  vec3f local_44;
  float local_38;
  vec3f local_34;
  float local_28;
  float local_24;
  void *local_20;
  float *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  vec3f::vec3f(&local_34,1.0,0.0,0.0);
  if (local_18[3] <= 0.0) {
    local_24 = (0.5 - *local_18) / local_18[3];
    local_28 = (-0.5 - *local_18) / local_18[3];
  }
  else {
    local_24 = (-0.5 - *local_18) / local_18[3];
    local_28 = (0.5 - *local_18) / local_18[3];
  }
  if (local_18[4] <= 0.0) {
    local_4c = (0.5 - local_18[1]) / local_18[4];
    if (local_24 < local_4c) {
      local_24 = local_4c;
      vec3f::vec3f(&local_58,0.0,1.0,0.0);
      local_34.x = local_58.x;
      local_34.y = local_58.y;
      local_34.z = local_58.z;
    }
    local_5c = (-0.5 - local_18[1]) / local_18[4];
    pfVar1 = std::min<float>(&local_28,&local_5c);
    local_28 = *pfVar1;
  }
  else {
    local_38 = (-0.5 - local_18[1]) / local_18[4];
    if (local_24 < local_38) {
      local_24 = local_38;
      vec3f::vec3f(&local_44,0.0,1.0,0.0);
      local_34.x = local_44.x;
      local_34.y = local_44.y;
      local_34.z = local_44.z;
    }
    local_48 = (0.5 - local_18[1]) / local_18[4];
    pfVar1 = std::min<float>(&local_28,&local_48);
    local_28 = *pfVar1;
  }
  if (local_18[5] <= 0.0) {
    local_74 = (0.5 - local_18[2]) / local_18[5];
    if (local_24 < local_74) {
      local_24 = local_74;
      vec3f::vec3f(&local_80,0.0,0.0,1.0);
      local_34.x = local_80.x;
      local_34.y = local_80.y;
      local_34.z = local_80.z;
    }
    local_84 = (-0.5 - local_18[2]) / local_18[5];
    pfVar1 = std::min<float>(&local_28,&local_84);
    local_28 = *pfVar1;
  }
  else {
    local_60 = (-0.5 - local_18[2]) / local_18[5];
    if (local_24 < local_60) {
      local_24 = local_60;
      vec3f::vec3f(&local_6c,0.0,0.0,1.0);
      local_34.x = local_6c.x;
      local_34.y = local_6c.y;
      local_34.z = local_6c.z;
    }
    local_70 = (0.5 - local_18[2]) / local_18[5];
    pfVar1 = std::min<float>(&local_28,&local_70);
    local_28 = *pfVar1;
  }
  if ((local_24 <= 0.0) || (local_28 < local_24)) {
    local_1 = false;
  }
  else {
    pVar2 = Ray::atParam(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    Ng = pVar2._0_8_;
    fVar3 = pVar2.z;
    p = Ng;
    fVar4 = fVar3;
    vec2f::vec2f((vec2f *)&stack0xffffffffffffff10,0.0);
    Primitive::Hit::Hit((Hit *)CONCAT44(in_stack_ffffffffffffff34,fVar4),p,
                        (vec3f *)CONCAT44(in_stack_ffffffffffffff24,fVar3),Ng,
                        (vec2f *)in_stack_ffffffffffffff10);
    memcpy(local_20,&stack0xffffffffffffff34,0x48);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		float tmin, tmax;
		vec3f resN = vec3f(1,0,0);

		if (ray.dir.x > 0) {
			tmin = (x1 - ray.origin.x) / ray.dir.x;
			tmax = (x2 - ray.origin.x) / ray.dir.x;
		}
		else {
			tmin = (x2 - ray.origin.x) / ray.dir.x;
			tmax = (x1 - ray.origin.x) / ray.dir.x;
		}
		if (ray.dir.y > 0) {
			float tminy = (y1 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y2 - ray.origin.y) / ray.dir.y);
		}
		else {
			float tminy = (y2 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y1 - ray.origin.y) / ray.dir.y);
		}
		if (ray.dir.z > 0) {
			float tminz = (z1 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z2 - ray.origin.z) / ray.dir.z);
		}
		else {
			float tminz = (z2 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z1 - ray.origin.z) / ray.dir.z);
		}
		if (0<tmin && tmin <= tmax)
		{
			*result = Hit(ray.atParam(tmin), resN, resN, 0); // TODO Cube texture
			return true;
		}
		return false;
	}